

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_char_(&)[11],_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
* __thiscall
Catch::ExprLhs<char_const(&)[11]>::operator==
          (BinaryExpr<const_char_(&)[11],_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *__return_storage_ptr__,ExprLhs<char_const(&)[11]> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  char (*lhs) [11];
  bool comparisonResult;
  StringRef local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs_local;
  ExprLhs<const_char_(&)[11]> *this_local;
  
  local_20 = rhs;
  rhs_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = (ExprLhs<const_char_(&)[11]> *)__return_storage_ptr__;
  comparisonResult = compareEqual<char[11],std::__cxx11::string>(*(char (**) [11])this,rhs);
  lhs = *(char (**) [11])this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_char_(&)[11],_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }